

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS
ref_interp_integrate
          (REF_GRID ref_grid,REF_DBL *candidate,REF_DBL *truth,REF_INT norm_power,REF_DBL *error)

{
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  REF_STATUS RVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  int cell;
  double dVar8;
  double dVar9;
  REF_DBL total_volume;
  REF_INT part;
  double local_f8;
  REF_MPI local_f0;
  REF_NODE local_e8;
  double local_e0;
  REF_DBL volume;
  double local_d0;
  double local_c8 [4];
  REF_INT nodes [27];
  
  local_f0 = ref_grid->mpi;
  local_e8 = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  *error = 0.0;
  total_volume = 0.0;
  local_e0 = (double)norm_power;
  local_f8 = 0.0;
  cell = 0;
  do {
    ref_mpi = local_f0;
    if (ref_cell->max <= cell) {
      uVar2 = ref_mpi_allsum(local_f0,error,1,3);
      if (uVar2 == 0) {
        dVar8 = pow(*error,1.0 / local_e0);
        *error = dVar8;
        uVar2 = ref_mpi_allsum(ref_mpi,&total_volume,1,3);
        if (uVar2 == 0) {
          *error = *error / total_volume;
          return 0;
        }
        pcVar6 = "all sum";
        uVar5 = 0xa34;
      }
      else {
        pcVar6 = "all sum";
        uVar5 = 0xa32;
      }
LAB_00127d3f:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             uVar5,"ref_interp_integrate",(ulong)uVar2,pcVar6);
      return uVar2;
    }
    RVar1 = ref_cell_nodes(ref_cell,cell,nodes);
    if (RVar1 == 0) {
      uVar2 = ref_cell_part(ref_cell,local_e8,cell,&part);
      if (uVar2 != 0) {
        pcVar6 = "owner";
        uVar5 = 0xa1e;
        goto LAB_00127d3f;
      }
      if (part == local_f0->id) {
        uVar2 = ref_node_tet_vol(local_e8,nodes,&volume);
        if (uVar2 != 0) {
          pcVar6 = "vol";
          uVar5 = 0xa20;
          goto LAB_00127d3f;
        }
        total_volume = local_f8 + volume;
        local_f8 = total_volume;
        for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 1) {
          local_c8[1] = (xq[lVar7] + 1.0) * 0.5;
          local_c8[2] = (yq[lVar7] + 1.0) * 0.5;
          local_c8[3] = (zq[lVar7] + 1.0) * 0.5;
          local_c8[0] = ((1.0 - local_c8[1]) - local_c8[2]) - local_c8[3];
          uVar3 = (ulong)(uint)ref_cell->node_per;
          if (ref_cell->node_per < 1) {
            uVar3 = 0;
          }
          dVar8 = 0.0;
          dVar9 = 0.0;
          for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
            dVar8 = dVar8 + candidate[nodes[uVar4]] * local_c8[uVar4];
            dVar9 = dVar9 + truth[nodes[uVar4]] * local_c8[uVar4];
          }
          dVar8 = dVar8 - dVar9;
          if (dVar8 <= -dVar8) {
            dVar8 = -dVar8;
          }
          local_d0 = wq[lVar7] * 0.75 * volume;
          dVar8 = pow(dVar8,local_e0);
          *error = dVar8 * local_d0 + *error;
        }
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_interp_integrate(REF_GRID ref_grid, REF_DBL *candidate,
                                        REF_DBL *truth, REF_INT norm_power,
                                        REF_DBL *error) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, cell, cell_node, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL diff, volume, total_volume, bary[4];
  REF_DBL candidate_at_gauss_point, truth_at_gauss_point;
  REF_INT part;
  *error = 0.0;
  total_volume = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "owner");
    if (part != ref_mpi_rank(ref_mpi)) continue;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    total_volume += volume;
    for (i = 0; i < nq; i++) {
      bary[1] = 0.5 * (1.0 + xq[i]);
      bary[2] = 0.5 * (1.0 + yq[i]);
      bary[3] = 0.5 * (1.0 + zq[i]);
      bary[0] = 1.0 - bary[1] - bary[2] - bary[3];
      candidate_at_gauss_point = 0.0;
      truth_at_gauss_point = 0.0;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        node = nodes[cell_node];
        candidate_at_gauss_point += bary[cell_node] * candidate[node];
        truth_at_gauss_point += bary[cell_node] * truth[node];
      }
      diff = ABS(candidate_at_gauss_point - truth_at_gauss_point);
      *error += (6.0 / 8.0) * wq[i] * volume * pow(diff, norm_power);
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, error, 1, REF_DBL_TYPE), "all sum");
  *error = pow(*error, 1.0 / ((REF_DBL)norm_power));
  RSS(ref_mpi_allsum(ref_mpi, &total_volume, 1, REF_DBL_TYPE), "all sum");
  *error /= total_volume;
  return REF_SUCCESS;
}